

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_otherTypeMoveConstructionForNotEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>
::optTyped_otherTypeMoveConstructionForNotEmpty_Test
          (optTyped_otherTypeMoveConstructionForNotEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
           *this)

{
  optTyped_otherTypeMoveConstructionForNotEmpty_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
  *this_local;
  
  anon_unknown.dwarf_dc07::optTyped<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>::optTyped
            (&this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>);
  (this->super_optTyped<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>).super_Test.
  _vptr_Test = (_func_int **)&PTR__optTyped_otherTypeMoveConstructionForNotEmpty_Test_00261518;
  return;
}

Assistant:

TYPED_TEST(optTyped, otherTypeMoveConstructionForNotEmpty)
{
  using opt_type = typename TestFixture::type;
  using other_opt_type = opt<typename TestFixture::traits::other_type, typename TestFixture::traits::other_policy_type>;
  other_opt_type o1{this->other_value_1};
  opt_type o2{std::move(o1)};
  EXPECT_TRUE(o2);
  EXPECT_TRUE(o2.has_value());
  EXPECT_EQ(this->value_1, *o2);
  EXPECT_EQ(this->value_1, o2.value());
  EXPECT_EQ(this->value_1, o2.value_or(this->value_2));
}